

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O2

uint64_t getBits(uint32_t nBits,uint64_t *c,uint32_t *lc,uint8_t **inptr)

{
  byte bVar1;
  byte *pbVar2;
  uint32_t uVar3;
  
  pbVar2 = *inptr;
  uVar3 = *lc;
  while (uVar3 < nBits) {
    bVar1 = *pbVar2;
    pbVar2 = pbVar2 + 1;
    *c = (ulong)bVar1 | *c << 8;
    uVar3 = uVar3 + 8;
    *lc = uVar3;
  }
  *inptr = pbVar2;
  *lc = uVar3 - nBits;
  return (ulong)((uint)(*c >> ((byte)(uVar3 - nBits) & 0x3f)) & ~(-1 << ((byte)nBits & 0x1f)));
}

Assistant:

static inline uint64_t
getBits (uint32_t nBits, uint64_t* c, uint32_t* lc, const uint8_t** inptr)
{
    const uint8_t* in = *inptr;
    while (*lc < nBits)
    {
        *c = (*c << 8) | (uint64_t) (*in++);
        *lc += 8;
    }

    *inptr = in;
    *lc -= nBits;
    return (*c >> *lc) & ((1 << nBits) - 1);
}